

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O2

REF_STATUS ref_grid_parse_unit(REF_GRID ref_grid,char *unit)

{
  uint uVar1;
  REF_GRID_UNIT RVar2;
  
  ref_grid->unit = REF_GRID_UNIT_LAST;
  uVar1 = (byte)*unit - 0x69;
  if ((uVar1 == 0) && (uVar1 = (byte)unit[1] - 0x6e, uVar1 == 0)) {
    uVar1 = (uint)(byte)unit[2];
  }
  RVar2 = (uint)(uVar1 != 0) << 2;
  ref_grid->unit = RVar2;
  uVar1 = (byte)*unit - 0x66;
  if ((uVar1 == 0) && (uVar1 = (byte)unit[1] - 0x74, uVar1 == 0)) {
    uVar1 = (uint)(byte)unit[2];
  }
  if (uVar1 == 0) {
    RVar2 = REF_GRID_FT;
  }
  ref_grid->unit = RVar2;
  uVar1 = (byte)*unit - 0x6d;
  if (uVar1 == 0) {
    uVar1 = (uint)(byte)unit[1];
  }
  if (uVar1 == 0) {
    RVar2 = REF_GRID_M;
  }
  ref_grid->unit = RVar2;
  uVar1 = (byte)*unit - 99;
  if ((uVar1 == 0) && (uVar1 = (byte)unit[1] - 0x6d, uVar1 == 0)) {
    uVar1 = (uint)(byte)unit[2];
  }
  if (uVar1 == 0) {
    RVar2 = REF_GRID_CM;
  }
  ref_grid->unit = RVar2;
  if (RVar2 == REF_GRID_UNIT_LAST) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0xed,
           "ref_grid_parse_unit","mesh_units not recognized");
  }
  return (uint)(RVar2 == REF_GRID_UNIT_LAST);
}

Assistant:

REF_FCN REF_STATUS ref_grid_parse_unit(REF_GRID ref_grid, const char *unit) {
  ref_grid_unit(ref_grid) = REF_GRID_UNIT_LAST;
  if (0 == strcmp("in", unit)) ref_grid_unit(ref_grid) = REF_GRID_IN;
  if (0 == strcmp("ft", unit)) ref_grid_unit(ref_grid) = REF_GRID_FT;
  if (0 == strcmp("m", unit)) ref_grid_unit(ref_grid) = REF_GRID_M;
  if (0 == strcmp("cm", unit)) ref_grid_unit(ref_grid) = REF_GRID_CM;
  RUS(REF_GRID_UNIT_LAST, ref_grid_unit(ref_grid), "mesh_units not recognized");
  return REF_SUCCESS;
}